

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O2

void __thiscall foxxll::linuxaio_queue::wait_requests(linuxaio_queue *this)

{
  __pid_t _Var1;
  value_type vVar2;
  long num_events;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  io_error *this_00;
  __sighandler_t __handler;
  aio_context_t aVar6;
  simple_vector<io_event> events;
  string local_1c8;
  ostringstream msg;
  
  _msg = (long)this->max_events_;
  tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::SimpleVector(&events,(size_type *)&msg);
  do {
    _Var1 = tlx::Semaphore::wait(&this->num_posted_requests_,(void *)0x1);
    vVar2 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                      (&this->wait_thread_state_);
    if (_Var1 == 0 && vVar2 == TERMINATING) {
      tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::~SimpleVector(&events);
      return;
    }
    while( true ) {
      aVar6 = this->context_;
      num_events = syscall(0xd0,aVar6,1,(ulong)(uint)this->max_events_,events.array_,0);
      if (-1 < num_events) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar4 = std::operator<<((ostream *)&msg,"Error in ");
        poVar4 = std::operator<<(poVar4,"void foxxll::linuxaio_queue::wait_requests()");
        poVar4 = std::operator<<(poVar4," : ");
        poVar4 = std::operator<<(poVar4,"linuxaio_queue::wait_requests io_getevents() nr_events=");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->max_events_);
        poVar4 = std::operator<<(poVar4," : ");
        pcVar5 = strerror(*piVar3);
        std::operator<<(poVar4,pcVar5);
        this_00 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        io_error::io_error(this_00,&local_1c8);
        __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    tlx::Semaphore::signal(&this->num_posted_requests_,(int)aVar6,__handler);
    handle_events(this,events.array_,num_events,false);
  } while( true );
}

Assistant:

void linuxaio_queue::wait_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // might block until next request is posted or message comes in
        int num_currently_posted_requests = num_posted_requests_.wait();

        // terminate if termination has been requested
        if (wait_thread_state_() == TERMINATING &&
            num_currently_posted_requests == 0)
            break;

        // wait for at least one of them to finish
        long num_events;
        while (1) {
            num_events = syscall(
                    SYS_io_getevents, context_, 1,
                    max_events_, events.data(), nullptr
                );

            if (num_events < 0) {
                if (errno == EINTR) {
                    // io_getevents may return prematurely in case a signal is
                    // received
                    continue;
                }

                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::wait_requests"
                    " io_getevents() nr_events=" << max_events_
                );
            }
            break;
        }

        // compensate for the one eaten prematurely above
        num_posted_requests_.signal();

        handle_events(events.data(), num_events, false);
    }
}